

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O1

void xSAT_SolverGarbageCollect(xSAT_Solver_t *s)

{
  xSAT_VecWatchList_t *pxVar1;
  int *piVar2;
  xSAT_Mem_t *__ptr;
  uint uVar3;
  xSAT_Mem_t *pDest;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  xSAT_Watcher_t *pxVar10;
  
  uVar7 = s->pMemory->nCap - s->pMemory->nWasted;
  pDest = (xSAT_Mem_t *)calloc(1,0x18);
  uVar3 = 0x100000;
  if (0 < (int)uVar7) {
    uVar3 = uVar7;
  }
  uVar7 = pDest->nCap;
  uVar6 = uVar7;
  if (uVar7 < uVar3) {
    while (uVar6 < uVar3) {
      uVar6 = uVar6 + ((uVar6 >> 3) + (uVar6 >> 1) & 0xfffffffe) + 2;
      pDest->nCap = uVar6;
      if (uVar6 < uVar7) {
        __assert_fail("p->nCap >= nPrevCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatMemory.h"
                      ,0x54,"void xSAT_MemGrow(xSAT_Mem_t *, unsigned int)");
      }
    }
    if (uVar6 == 0) {
      __assert_fail("p->nCap > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatMemory.h"
                    ,0x56,"void xSAT_MemGrow(xSAT_Mem_t *, unsigned int)");
    }
    if (pDest->pData == (uint *)0x0) {
      puVar4 = (uint *)malloc((ulong)uVar6 << 2);
    }
    else {
      puVar4 = (uint *)realloc(pDest->pData,(ulong)uVar6 << 2);
    }
    pDest->pData = puVar4;
  }
  if (0 < s->vAssigns->nSize) {
    lVar9 = 0;
    do {
      pxVar1 = s->vWatches;
      if (pxVar1->nCap <= lVar9) {
LAB_008e841a:
        __assert_fail("iEntry < v->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                      ,0x106,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      if (pxVar1->nSize <= lVar9) {
LAB_008e83fb:
        __assert_fail("iEntry < v->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                      ,0x107,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      lVar8 = (long)pxVar1->pArray[lVar9].nSize;
      if (lVar8 != 0) {
        pxVar10 = pxVar1->pArray[lVar9].pArray;
        lVar8 = lVar8 << 3;
        do {
          xSAT_SolverClaRealloc(pDest,s->pMemory,&pxVar10->CRef);
          pxVar10 = pxVar10 + 1;
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      pxVar1 = s->vBinWatches;
      if (pxVar1->nCap <= lVar9) goto LAB_008e841a;
      if (pxVar1->nSize <= lVar9) goto LAB_008e83fb;
      lVar8 = (long)pxVar1->pArray[lVar9].nSize;
      if (lVar8 != 0) {
        pxVar10 = pxVar1->pArray[lVar9].pArray;
        lVar8 = lVar8 << 3;
        do {
          xSAT_SolverClaRealloc(pDest,s->pMemory,&pxVar10->CRef);
          pxVar10 = pxVar10 + 1;
          lVar8 = lVar8 + -8;
        } while (lVar8 != 0);
      }
      lVar9 = lVar9 + 1;
      lVar8 = (long)s->vAssigns->nSize;
    } while (SBORROW8(lVar9,lVar8 * 2) != lVar9 + lVar8 * -2 < 0);
  }
  pVVar5 = s->vTrail;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      uVar3 = pVVar5->pArray[lVar9] >> 1;
      if (((int)uVar3 < 0) || (s->vReasons->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = s->vReasons->pArray;
      if (piVar2[uVar3] != -1) {
        xSAT_SolverClaRealloc(pDest,s->pMemory,(uint *)(piVar2 + uVar3));
      }
      lVar9 = lVar9 + 1;
      pVVar5 = s->vTrail;
    } while (lVar9 < pVVar5->nSize);
  }
  if (0 < s->vLearnts->nSize) {
    puVar4 = (uint *)s->vLearnts->pArray;
    lVar9 = 0;
    do {
      xSAT_SolverClaRealloc(pDest,s->pMemory,puVar4);
      lVar9 = lVar9 + 1;
      puVar4 = puVar4 + 1;
    } while (lVar9 < s->vLearnts->nSize);
  }
  if (0 < s->vClauses->nSize) {
    puVar4 = (uint *)s->vClauses->pArray;
    lVar9 = 0;
    do {
      xSAT_SolverClaRealloc(pDest,s->pMemory,puVar4);
      lVar9 = lVar9 + 1;
      puVar4 = puVar4 + 1;
    } while (lVar9 < s->vClauses->nSize);
  }
  __ptr = s->pMemory;
  if (__ptr->pData != (uint *)0x0) {
    free(__ptr->pData);
    __ptr->pData = (uint *)0x0;
  }
  if (__ptr != (xSAT_Mem_t *)0x0) {
    free(__ptr);
  }
  s->pMemory = pDest;
  return;
}

Assistant:

void xSAT_SolverGarbageCollect( xSAT_Solver_t * s )
{
    int i;
    unsigned * pArray;
    xSAT_Mem_t * pNewMemMngr = xSAT_MemAlloc(  xSAT_MemCap( s->pMemory ) - xSAT_MemWastedCap( s->pMemory ) );

    for ( i = 0; i < 2 * Vec_StrSize( s->vAssigns ); i++ )
    {
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vWatches, i);
        xSAT_Watcher_t* begin = xSAT_WatchListArray(ws);
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize(ws);
        xSAT_Watcher_t *w;

        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );

        ws = xSAT_VecWatchListEntry( s->vBinWatches, i);
        begin = xSAT_WatchListArray(ws);
        end   = begin + xSAT_WatchListSize(ws);
        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );
    }

    for ( i = 0; i < Vec_IntSize( s->vTrail ); i++ )
        if ( ( unsigned ) Vec_IntEntry( s->vReasons, xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) ) ) != CRefUndef )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, ( unsigned * ) &( Vec_IntArray( s->vReasons )[xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) )] ) );

    pArray = ( unsigned * ) Vec_IntArray( s->vLearnts );
    for ( i = 0; i < Vec_IntSize( s->vLearnts ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    pArray = ( unsigned * ) Vec_IntArray( s->vClauses );
    for ( i = 0; i < Vec_IntSize( s->vClauses ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    xSAT_MemFree( s->pMemory );
    s->pMemory = pNewMemMngr;
}